

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STDAllocator.hpp
# Opt level: O3

void __thiscall
Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>::operator()
          (STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator> *this,
          BufferViewVkImpl *ptr)

{
  string msg;
  string local_30;
  
  if (this->m_Allocator == (FixedBlockMemoryAllocator *)0x0) {
    FormatString<char[72]>
              (&local_30,
               (char (*) [72])
               "The deleter has been moved away or never initialized, and can\'t be used");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/STDAllocator.hpp"
               ,0xd1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  BufferViewVkImpl::~BufferViewVkImpl(ptr);
  FixedBlockMemoryAllocator::Free(this->m_Allocator,ptr);
  return;
}

Assistant:

void operator()(T* ptr) noexcept
    {
        VERIFY(m_Allocator != nullptr, "The deleter has been moved away or never initialized, and can't be used");
        Destruct(ptr);
        m_Allocator->Free(ptr);
    }